

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pulseaudio.cpp
# Opt level: O2

void __thiscall anon_unknown.dwarf_26ba73::PulseCapture::~PulseCapture(PulseCapture *this)

{
  ~PulseCapture(this);
  al_free(this);
  return;
}

Assistant:

PulseCapture::~PulseCapture()
{
    if(!mContext)
        return;

    mMainloop.close(mContext, mStream);
    mContext = nullptr;
    mStream = nullptr;
}